

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidget::isEnabledTo(QWidget *this,QWidget *ancestor)

{
  uint uVar1;
  
  do {
    uVar1 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if ((((uVar1 & 1) != 0) ||
        (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) ||
       (this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10), this == (QWidget *)0x0)) break;
  } while (this != ancestor);
  return (uVar1 & 1) == 0;
}

Assistant:

bool QWidget::isEnabledTo(const QWidget *ancestor) const
{
    const QWidget * w = this;
    while (!w->testAttribute(Qt::WA_ForceDisabled)
            && !w->isWindow()
            && w->parentWidget()
            && w->parentWidget() != ancestor)
        w = w->parentWidget();
    return !w->testAttribute(Qt::WA_ForceDisabled);
}